

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# afloader.c
# Opt level: O3

FT_Int32 af_loader_compute_darkening(AF_Loader loader,FT_Face face,FT_Pos standard_width)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  FT_Long FVar8;
  ulong uVar9;
  FT_Long FVar10;
  FT_Long FVar11;
  int iVar12;
  long in_RCX;
  long lVar13;
  uint uVar14;
  ulong uVar15;
  uint uVar16;
  ulong b_;
  
  b_ = 0x40000;
  if (3 < (ushort)standard_width) {
    b_ = (ulong)(uint)((int)standard_width << 0x10);
  }
  FVar8 = FT_DivFix(0x3e80000,(ulong)(uint)((int)face << 0x10));
  if (FVar8 < 0x28f) {
    return 0;
  }
  if (in_RCX < 1) {
    lVar13 = 0x4b0000;
  }
  else {
    lVar13 = (long)(int)FVar8 * (long)((int)in_RCX << 0x10);
    lVar13 = (long)(int)((ulong)((lVar13 >> 0x3f) + lVar13 + 0x8000) >> 0x10);
  }
  iVar12 = *(int *)&loader->field_0x24;
  iVar1 = *(int *)((long)&(loader->trans_matrix).yx + 4);
  iVar6 = 0x1f;
  uVar14 = (uint)lVar13;
  if (uVar14 != 0) {
    for (; uVar14 >> iVar6 == 0; iVar6 = iVar6 + -1) {
    }
  }
  iVar7 = 0x1f;
  uVar16 = (uint)b_;
  if (uVar16 != 0) {
    for (; uVar16 >> iVar7 == 0; iVar7 = iVar7 + -1) {
    }
  }
  if ((uint)(iVar7 + iVar6) < 0x2e) {
    uVar9 = (ulong)(int)((ulong)((int)uVar16 * lVar13 + ((int)uVar16 * lVar13 >> 0x3f) + 0x8000) >>
                        0x10);
  }
  else {
    uVar9 = (ulong)(uint)(iVar1 << 0x10);
  }
  iVar6 = (int)(loader->trans_matrix).xx;
  uVar15 = (ulong)(uint)(iVar12 << 0x10);
  if ((long)uVar15 <= (long)uVar9) {
    iVar7 = *(int *)((long)&(loader->trans_matrix).xx + 4);
    iVar2 = (int)(loader->trans_matrix).xy;
    iVar3 = *(int *)((long)&(loader->trans_matrix).xy + 4);
    iVar4 = (int)(loader->trans_matrix).yx;
    iVar5 = (int)(loader->trans_matrix).yy;
    if (uVar9 < (uint)(iVar7 << 0x10)) {
      FVar10 = FT_DivFix(uVar15,b_);
      iVar12 = iVar7 - iVar12;
      if (iVar12 != 0) {
        FVar10 = FT_MulDiv((long)(int)(uVar14 - (int)FVar10),(long)(iVar2 - iVar6),(long)iVar12);
        FVar11 = FT_DivFix((ulong)(uint)(iVar6 << 0x10),b_);
        FVar11 = FVar11 + FVar10;
        goto LAB_0023f321;
      }
LAB_0023f26b:
      FVar10 = FT_DivFix((ulong)(uint)(iVar7 << 0x10),b_);
      if (iVar3 - iVar7 != 0) {
        FVar10 = FT_MulDiv((long)(int)(uVar14 - (int)FVar10),(long)(iVar4 - iVar2),
                           (long)(iVar3 - iVar7));
        FVar11 = FT_DivFix((ulong)(uint)(iVar2 << 0x10),b_);
        FVar11 = FVar11 + FVar10;
        goto LAB_0023f321;
      }
      uVar15 = (ulong)(uint)(iVar3 << 0x10);
    }
    else {
      uVar15 = (ulong)(uint)(iVar3 << 0x10);
      if (uVar9 < uVar15) goto LAB_0023f26b;
      iVar6 = iVar5;
      if ((uint)(iVar1 << 0x10) <= uVar9) goto LAB_0023f2ad;
    }
    FVar10 = FT_DivFix(uVar15,b_);
    iVar6 = iVar5;
    if (iVar1 - iVar3 != 0) {
      FVar10 = FT_MulDiv((long)(int)(uVar14 - (int)FVar10),(long)(iVar5 - iVar4),
                         (long)(iVar1 - iVar3));
      FVar11 = FT_DivFix((ulong)(uint)(iVar4 << 0x10),b_);
      FVar11 = FVar11 + FVar10;
      goto LAB_0023f321;
    }
  }
LAB_0023f2ad:
  FVar11 = FT_DivFix((ulong)(uint)(iVar6 << 0x10),b_);
LAB_0023f321:
  FVar8 = FT_DivFix(FVar11,FVar8);
  return (int)FVar8 + 0x8000 >> 0x10;
}

Assistant:

FT_LOCAL_DEF( FT_Int32 )
  af_loader_compute_darkening( AF_Loader  loader,
                               FT_Face    face,
                               FT_Pos     standard_width )
  {
    AF_Module  module = loader->globals->module;

    FT_UShort  units_per_EM;
    FT_Fixed   ppem, em_ratio;
    FT_Fixed   stem_width, stem_width_per_1000, scaled_stem, darken_amount;
    FT_Int     log_base_2;
    FT_Int     x1, y1, x2, y2, x3, y3, x4, y4;


    ppem         = FT_MAX( af_intToFixed( 4 ),
                           af_intToFixed( face->size->metrics.x_ppem ) );
    units_per_EM = face->units_per_EM;

    em_ratio = FT_DivFix( af_intToFixed( 1000 ),
                          af_intToFixed ( units_per_EM ) );
    if ( em_ratio < af_floatToFixed( .01 ) )
    {
      /* If something goes wrong, don't embolden. */
      return 0;
    }

    x1 = module->darken_params[0];
    y1 = module->darken_params[1];
    x2 = module->darken_params[2];
    y2 = module->darken_params[3];
    x3 = module->darken_params[4];
    y3 = module->darken_params[5];
    x4 = module->darken_params[6];
    y4 = module->darken_params[7];

    if ( standard_width <= 0 )
    {
      stem_width          = af_intToFixed( 75 ); /* taken from cf2font.c */
      stem_width_per_1000 = stem_width;
    }
    else
    {
      stem_width          = af_intToFixed( standard_width );
      stem_width_per_1000 = FT_MulFix( stem_width, em_ratio );
    }

    log_base_2 = FT_MSB( (FT_UInt32)stem_width_per_1000 ) +
                 FT_MSB( (FT_UInt32)ppem );

    if ( log_base_2 >= 46 )
    {
      /* possible overflow */
      scaled_stem = af_intToFixed( x4 );
    }
    else
      scaled_stem = FT_MulFix( stem_width_per_1000, ppem );

    /* now apply the darkening parameters */
    if ( scaled_stem < af_intToFixed( x1 ) )
      darken_amount = FT_DivFix( af_intToFixed( y1 ), ppem );

    else if ( scaled_stem < af_intToFixed( x2 ) )
    {
      FT_Int  xdelta = x2 - x1;
      FT_Int  ydelta = y2 - y1;
      FT_Int  x      = stem_width_per_1000 -
                       FT_DivFix( af_intToFixed( x1 ), ppem );


      if ( !xdelta )
        goto Try_x3;

      darken_amount = FT_MulDiv( x, ydelta, xdelta ) +
                      FT_DivFix( af_intToFixed( y1 ), ppem );
    }

    else if ( scaled_stem < af_intToFixed( x3 ) )
    {
    Try_x3:
      {
        FT_Int  xdelta = x3 - x2;
        FT_Int  ydelta = y3 - y2;
        FT_Int  x      = stem_width_per_1000 -
                         FT_DivFix( af_intToFixed( x2 ), ppem );


        if ( !xdelta )
          goto Try_x4;

        darken_amount = FT_MulDiv( x, ydelta, xdelta ) +
                        FT_DivFix( af_intToFixed( y2 ), ppem );
      }
    }

    else if ( scaled_stem < af_intToFixed( x4 ) )
    {
    Try_x4:
      {
        FT_Int  xdelta = x4 - x3;
        FT_Int  ydelta = y4 - y3;
        FT_Int  x      = stem_width_per_1000 -
                         FT_DivFix( af_intToFixed( x3 ), ppem );


        if ( !xdelta )
          goto Use_y4;

        darken_amount = FT_MulDiv( x, ydelta, xdelta ) +
                        FT_DivFix( af_intToFixed( y3 ), ppem );
      }
    }

    else
    {
    Use_y4:
      darken_amount = FT_DivFix( af_intToFixed( y4 ), ppem );
    }

    /* Convert darken_amount from per 1000 em to true character space. */
    return af_fixedToInt( FT_DivFix( darken_amount, em_ratio ) );
  }